

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Type __thiscall wasm::TranslateToFuzzReader::getReferenceType(TranslateToFuzzReader *this)

{
  Random *this_00;
  ulong uVar1;
  uint32_t uVar2;
  FeatureOptions<wasm::Type> *pFVar3;
  Type TVar4;
  value_type *pvVar5;
  ulong uVar6;
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>
  local_58;
  
  if ((((this->wasm->features).features & 0x100) != 0) &&
     ((this->interestingHeapTypes).
      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->interestingHeapTypes).
      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    this_00 = &this->random;
    uVar2 = Random::upTo(this_00,2);
    if (uVar2 == 0) {
      pvVar5 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                         (this_00,&this->interestingHeapTypes);
      uVar1 = pvVar5->id;
      if ((((this->wasm->features).features & 0x400) == 0) ||
         (uVar2 = Random::upTo(this_00,2), uVar2 != 0)) {
        uVar6 = 2;
      }
      else {
        uVar6 = 0;
      }
      if (((uint)(0x7c < uVar1) * 4 + 3 & (uint)uVar1) == 0) {
        return (Type)(uVar6 | uVar1);
      }
      __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
    }
  }
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl._0_8_ = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  pFVar3 = Random::FeatureOptions<wasm::Type>::add<>
                     ((FeatureOptions<wasm::Type> *)&local_58,(FeatureSet)0x100,(Type)0x12);
  pFVar3 = Random::FeatureOptions<wasm::Type>::
           add<wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type>
                     (pFVar3,(FeatureSet)0x500,(Type)0x10,(Type)0x20,(Type)0x2a,(Type)0x28,
                      (Type)0x32,(Type)0x30,(Type)0x3a,(Type)0x38,(Type)0x42,(Type)0x40);
  pFVar3 = Random::FeatureOptions<wasm::Type>::add<wasm::Type>
                     (pFVar3,(FeatureSet)0x4000,(Type)0x52,(Type)0x50);
  TVar4 = Random::pick<wasm::Type>(&this->random,pFVar3);
  std::
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>
  ::~_Rb_tree(&local_58);
  return (Type)TVar4.id;
}

Assistant:

Type TranslateToFuzzReader::getReferenceType() {
  if (wasm.features.hasReferenceTypes() && !interestingHeapTypes.empty() &&
      oneIn(2)) {
    auto heapType = pick(interestingHeapTypes);
    auto nullability = getNullability();
    return Type(heapType, nullability);
  }
  return pick(FeatureOptions<Type>()
                // TODO: Add externref here.
                .add(FeatureSet::ReferenceTypes, Type(HeapType::func, Nullable))
                .add(FeatureSet::ReferenceTypes | FeatureSet::GC,
                     Type(HeapType::func, NonNullable),
                     Type(HeapType::any, NonNullable),
                     Type(HeapType::eq, Nullable),
                     Type(HeapType::eq, NonNullable),
                     Type(HeapType::i31, Nullable),
                     Type(HeapType::i31, NonNullable),
                     Type(HeapType::struct_, Nullable),
                     Type(HeapType::struct_, NonNullable),
                     Type(HeapType::array, Nullable),
                     Type(HeapType::array, NonNullable))
                .add(FeatureSet::Strings,
                     Type(HeapType::string, Nullable),
                     Type(HeapType::string, NonNullable)));
}